

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iGenfuner.cpp
# Opt level: O3

bool __thiscall Imaginer::Utils::iGenFuner::generater(iGenFuner *this)

{
  double __y;
  RPNnode *pRVar1;
  _funer *p_Var2;
  undefined1 uVar3;
  bool bVar4;
  RPNnode *pRVar5;
  long lVar6;
  ostream *poVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  RPNnode curnode;
  iRpn rpn;
  byte local_a1;
  ulong local_a0;
  iStack<Imaginer::Utils::iRpn::RPNnode> local_98;
  iGenFuner *local_88;
  uint local_7c;
  anon_union_8_2_93b31755_for__node local_78;
  bool local_70;
  ulong local_68;
  anon_union_8_2_93b31755_for__node local_60;
  ulong local_58;
  iRpn local_50;
  
  local_88 = this;
  iRpn::iRpn(&local_50,this->_expname);
  bVar4 = iRpn::genRpn(&local_50);
  if (bVar4) {
    local_98._size = 0x400;
    local_98._top = -1;
    pRVar5 = (RPNnode *)operator_new__(0x4000);
    lVar6 = 0;
    do {
      (&pRVar5->_is)[lVar6] = false;
      *(undefined8 *)((long)&pRVar5->_node + lVar6) = 0;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x4000);
    local_68 = (ulong)(local_50._operands)->_top;
    local_70 = false;
    local_78._value = 0.0;
    local_98._data = pRVar5;
    if (-1 < (long)local_68) {
      local_58 = (ulong)((local_50._operands)->_top + 1);
      uVar11 = 0xffffffff;
      lVar6 = 8;
      uVar12 = 0;
      bVar4 = false;
      local_7c = 0;
      local_a0 = 0;
      do {
        pRVar1 = (local_50._operands)->_data;
        if ((anon_union_8_2_93b31755_for__node *)((long)pRVar1 + lVar6 + -8) != &local_78) {
          local_78 = *(anon_union_8_2_93b31755_for__node *)((long)pRVar1 + lVar6 + -8);
          local_70 = *(bool *)((long)&pRVar1->_node + lVar6);
        }
        iVar10 = (int)uVar11;
        if ((local_70 & 1U) == 0) {
          uVar3 = local_78._sign;
          if ((local_78._sign + 0xa8U & 0xde) == 0) {
            local_60 = (anon_union_8_2_93b31755_for__node)
                       ((ulong)local_60 & 0xffffffffffffff00 | (ulong)local_78 & 0xff);
            local_98._top = iVar10 + 1;
            uVar11 = (ulong)(uint)local_98._top;
            pRVar5[(long)iVar10 + 1]._node = local_60;
            pRVar5[(long)iVar10 + 1]._is = false;
            local_7c = local_7c & 0xff;
            if (local_98._top != 0xffffffff) {
              local_7c = 1;
            }
            local_a0 = 1;
          }
          else {
            if (iVar10 < 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"expression invaild: ",0x14);
              local_a1 = uVar3;
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(char *)&local_a1,1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," need two operands",0x12);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              goto LAB_00104204;
            }
            uVar8 = iVar10 - 1;
            dVar13 = pRVar5[uVar11]._node._value;
            local_98._top = iVar10 - 2U;
            __y = pRVar5[uVar8]._node._value;
            if ((byte)local_78._sign - 0x2a < 6) {
              switch((uint)(byte)local_78._sign) {
              case 0x2a:
                if ((local_a0 & 1) != 0) {
LAB_0010415d:
                  p_Var2 = (local_88->_opstream)._data;
                  lVar9 = (long)(local_88->_opstream)._top + 1;
                  (local_88->_opstream)._top = (int)lVar9;
                  p_Var2[lVar9]._fun = _funer::_add;
                  p_Var2[lVar9]._value = dVar13;
                  goto switchD_0010409a_caseD_2c;
                }
                dVar13 = dVar13 * __y;
                break;
              case 0x2b:
                if ((local_a0 & 1) != 0) goto LAB_0010415d;
                dVar13 = dVar13 + __y;
                break;
              default:
                goto switchD_0010409a_caseD_2c;
              case 0x2d:
                if ((local_a0 & 1) != 0) goto LAB_0010415d;
                dVar13 = dVar13 - __y;
                break;
              case 0x2f:
                if ((local_a0 & 1) != 0) goto LAB_0010415d;
                dVar13 = dVar13 / __y;
              }
              local_98._top = uVar8;
              pRVar5[uVar8]._node = (anon_union_8_2_93b31755_for__node)(dVar13 & 0xffffffffffffff00)
              ;
              pRVar5[uVar8]._is = true;
              uVar11 = (ulong)uVar8;
            }
            else {
              if (local_78._sign == 0x5e) {
                if ((local_a0 & 1) != 0) goto LAB_0010415d;
                dVar13 = pow(dVar13,__y);
                uVar11 = (ulong)(iVar10 - 1U);
                local_98._top = iVar10 - 1U;
                pRVar5[uVar11]._node =
                     (anon_union_8_2_93b31755_for__node)(dVar13 & 0xffffffffffffff00);
                pRVar5[uVar11]._is = true;
                goto LAB_001041a7;
              }
switchD_0010409a_caseD_2c:
              uVar11 = (ulong)(iVar10 - 2U);
            }
          }
        }
        else {
          uVar11 = (ulong)(iVar10 + 1U);
          local_98._top = iVar10 + 1U;
          pRVar5[(long)iVar10 + 1]._node = local_78;
          pRVar5[(long)iVar10 + 1]._is = local_70;
          poVar7 = operator<<((ostream *)&std::cout,(RPNnode *)&local_78);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        }
LAB_001041a7:
        bVar4 = local_68 <= uVar12;
        uVar12 = uVar12 + 1;
        lVar6 = lVar6 + 0x10;
      } while (local_58 != uVar12);
    }
    poVar7 = operator<<((ostream *)&std::cout,&local_98);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    bVar4 = true;
    std::ostream::flush();
LAB_00104204:
    if (local_98._data != (RPNnode *)0x0) {
      operator_delete__(local_98._data);
    }
  }
  else {
    bVar4 = false;
  }
  iRpn::~iRpn(&local_50);
  return bVar4;
}

Assistant:

bool   iGenFuner::generater()
{
    iRpn rpn(_expname);
    if(! rpn.genRpn())
        return false;
    iStack<iRpn::RPNnode> result;
    iStack<iRpn::RPNnode>* _operands = rpn.getOperands();
    int size = _operands->size();
    iRpn::RPNnode curnode;    
    char op = '\0';
    bool haveXY = false;
    iRpn::RPNnode  loperand;
    iRpn::RPNnode  roperand;
    bool top_bottom = false;//flag to record a unkowns value is top(true) or bottom(false)
    for(int i = 0;i <= size; ++i)
    {
        curnode = (*_operands)[i];
        if(!curnode)//opearator
        {
            op = curnode;
            if(rpn.isVariable(op))//未知数
            {
                haveXY = true;
                result.push(op);
                if(!result.empty())
                {
                    top_bottom = true;
                }
            }else
            {
                if(result.size() < 1)
                {
                    std::cout << "expression invaild: " << op  <<
                                 " need two operands" << std::endl;
                    return false;
                }
                loperand = result.pop();
                roperand = result.pop();
                switch (op) {
                case '+':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));
                        break;
                    }
                    result.push(loperand+roperand);
                    break;
                case '-':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));
                        break;
                    }
                    result.push(loperand-roperand);
                    break;
                case '*':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));

                        break;
                    }
                    result.push(loperand*roperand);
                    break;
                case '/':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));
                        break;
                    }
                    result.push(loperand/roperand);
                    break;
                case '^':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));
                        break;
                    }
                    result.push(loperand^roperand);
                    break;
                default:
                    break;
                }
            }
        }
        else//operand
        {
            result.push(curnode);
            std::cout << curnode << "\n";
        }
    }
    std::cout << result << std::endl;
    //result.destroy();
    return true;
}